

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O1

format crnlib::texture_file_types::determine_file_format(char *pFilename)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  format fVar4;
  char **ppcVar5;
  uint i;
  long lVar6;
  dynamic_string ext;
  dynamic_string local_30;
  
  local_30.m_buf_size = 0;
  local_30.m_len = 0;
  local_30.m_pStr = (char *)0x0;
  bVar1 = file_utils::split_path
                    (pFilename,(dynamic_string *)0x0,(dynamic_string *)0x0,(dynamic_string *)0x0,
                     &local_30);
  fVar4 = cFormatInvalid;
  if (bVar1 && local_30.m_len != 0) {
    pcVar3 = "";
    if (local_30.m_pStr != (char *)0x0) {
      pcVar3 = local_30.m_pStr;
    }
    if (*pcVar3 == '.') {
      dynamic_string::right(&local_30,1);
    }
    ppcVar5 = get_extension::extensions;
    lVar6 = 0;
    do {
      iVar2 = dynamic_string::compare(&local_30,*ppcVar5,false);
      if (iVar2 == 0) {
        fVar4 = (format)lVar6;
        break;
      }
      lVar6 = lVar6 + 1;
      ppcVar5 = ppcVar5 + 1;
    } while (lVar6 != 0x11);
  }
  if ((local_30.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_30.m_pStr + -8) ^ *(uint *)(local_30.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_30.m_pStr + -0x10);
  }
  return fVar4;
}

Assistant:

texture_file_types::format texture_file_types::determine_file_format(const char* pFilename) {
  dynamic_string ext;
  if (!file_utils::split_path(pFilename, NULL, NULL, NULL, &ext))
    return cFormatInvalid;

  if (ext.is_empty())
    return cFormatInvalid;

  if (ext[0] == '.')
    ext.right(1);

  for (uint i = 0; i < cNumFileFormats; i++)
    if (ext == get_extension(static_cast<format>(i)))
      return static_cast<format>(i);

  return cFormatInvalid;
}